

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O2

void __thiscall
ParticleTest_Assignment_Test<pica::Particle<(pica::Dimension)3>_>::TestBody
          (ParticleTest_Assignment_Test<pica::Particle<(pica::Dimension)3>_> *this)

{
  long lVar1;
  long lVar2;
  Particle<(pica::Dimension)3> *pPVar3;
  double *pdVar4;
  double *pdVar5;
  byte bVar6;
  Particle<(pica::Dimension)3> in_stack_fffffffffffffe68;
  Particle<(pica::Dimension)3> in_stack_fffffffffffffeb0;
  AssertHelper local_108;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_100;
  String local_f8;
  AssertionResult gtest_ar_;
  MomentumType local_d8;
  PositionType position;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  FactorType local_78;
  GammaType GStack_70;
  TypeIndexType local_68;
  ParticleType particle;
  
  bVar6 = 0;
  BaseParticleFixture<pica::Particle<(pica::Dimension)3>_>::getPosition
            (&position,(BaseParticleFixture<pica::Particle<(pica::Dimension)3>_> *)this,432.453,
             -3452.15,-15.125);
  local_d8.x = 431.124;
  local_d8.y = -54.12;
  local_d8.z = 5643.176;
  pica::Particle<(pica::Dimension)3>::Particle(&particle,&position,&local_d8,1.9945,0);
  local_88 = particle.p.y;
  dStack_80 = particle.p.z;
  local_98 = particle.position.z;
  dStack_90 = particle.p.x;
  local_a8 = particle.position.x;
  dStack_a0 = particle.position.y;
  local_78 = particle.factor;
  GStack_70 = particle.invGamma;
  local_68 = particle.typeIndex;
  lVar2 = 9;
  pPVar3 = &particle;
  pdVar4 = (double *)&stack0xfffffffffffffe68;
  for (lVar1 = lVar2; lVar1 != 0; lVar1 = lVar1 + -1) {
    *pdVar4 = (pPVar3->position).x;
    pPVar3 = (Particle<(pica::Dimension)3> *)((long)pPVar3 + (ulong)bVar6 * -0x10 + 8);
    pdVar4 = pdVar4 + (ulong)bVar6 * -2 + 1;
  }
  pdVar4 = &local_a8;
  pdVar5 = (double *)&stack0xfffffffffffffeb0;
  for (; lVar2 != 0; lVar2 = lVar2 + -1) {
    *pdVar5 = *pdVar4;
    pdVar4 = pdVar4 + (ulong)bVar6 * -2 + 1;
    pdVar5 = pdVar5 + (ulong)bVar6 * -2 + 1;
  }
  gtest_ar_.success_ =
       BaseParticleFixture<pica::Particle<(pica::Dimension)3>>::
       eqParticles_<pica::Particle<(pica::Dimension)3>,pica::Particle<(pica::Dimension)3>>
                 ((BaseParticleFixture<pica::Particle<(pica::Dimension)3>> *)this,
                  in_stack_fffffffffffffe68,in_stack_fffffffffffffeb0);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_100);
    testing::internal::GetBoolAssertionFailureMessage
              ((internal *)&local_f8,&gtest_ar_,"this->eqParticles_(particle, copyParticle)","false"
               ,"true");
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
               ,0x70,local_f8.c_str_);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    testing::internal::String::~String(&local_f8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_100);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  return;
}

Assistant:

TYPED_TEST(ParticleTest, Assignment)
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;
    typedef typename ParticleTest<TypeParam>::PositionType PositionType;
    typedef typename ParticleTest<TypeParam>::MomentumType MomentumType;
    typedef typename ParticleTest<TypeParam>::GammaType GammaType;
    typedef typename ParticleTest<TypeParam>::FactorType FactorType;

    PositionType position = this->getPosition(432.453, -3452.15, -15.125);
    MomentumType momentum(431.124, -54.12, 5643.176);
    FactorType factor = 1.9945;
    ParticleType particle(position, momentum, factor, 0);
    ParticleType copyParticle;
    copyParticle = particle;
    ASSERT_TRUE(this->eqParticles_(particle, copyParticle));
}